

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O2

void extendResult(cmGeneratorExpressionEvaluatorVector *result,
                 cmGeneratorExpressionEvaluatorVector *contents)

{
  cmGeneratorExpressionEvaluator *pcVar1;
  pointer puVar2;
  const_iterator __position;
  int iVar3;
  
  puVar2 = (result->
           super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((result->
      super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start != puVar2) {
    iVar3 = (*(puVar2[-1]._M_t.
               super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
               .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl)->
              _vptr_cmGeneratorExpressionEvaluator[2])();
    if (iVar3 == 0) {
      iVar3 = (**(code **)(*(long *)(((contents->
                                      super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                    super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                                    ._M_t + 0x10))();
      if (iVar3 == 0) {
        __position._M_current =
             (contents->
             super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (result->
                 super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl + 2;
        pcVar1->_vptr_cmGeneratorExpressionEvaluator =
             (_func_int **)
             ((long)pcVar1->_vptr_cmGeneratorExpressionEvaluator +
             (long)((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                   .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl[2].
                   _vptr_cmGeneratorExpressionEvaluator);
        std::
        vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
        ::erase(contents,__position);
      }
    }
  }
  cm::
  append<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_0>
            (result,contents);
  return;
}

Assistant:

static void extendResult(
  cmGeneratorExpressionParser::cmGeneratorExpressionEvaluatorVector& result,
  cmGeneratorExpressionParser::cmGeneratorExpressionEvaluatorVector&& contents)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text &&
      contents.front()->GetType() == cmGeneratorExpressionEvaluator::Text) {
    cm::static_reference_cast<TextContent>(*(result.end() - 1))
      .Extend(
        cm::static_reference_cast<TextContent>(contents.front()).GetLength());
    contents.erase(contents.begin());
  }
  cm::append(result, std::move(contents));
}